

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O3

size_t ucs2_bytelen(char *str,ssize_t max_sz)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  char *p;
  
  if (max_sz == 0 || str == (char *)0x0) {
    return 0;
  }
  sVar3 = 1;
  if (max_sz != 1) {
    sVar2 = 0;
    do {
      if ((str[sVar2] == '\0') && (str[sVar2 + 1] == '\0')) {
        return sVar2;
      }
      lVar1 = sVar2 + 3;
      sVar2 = sVar2 + 2;
      sVar3 = max_sz;
    } while (lVar1 < max_sz || max_sz < 0);
  }
  return sVar3;
}

Assistant:

size_t
ucs2_bytelen   (const char   *str,
                ssize_t       max_sz)
{
    char *p = (char *) str;

    if (str == NULL || max_sz == 0)
        return 0;

    if (max_sz == 1)
        return 1;

    while (*p || *(p+1))
    {
        p += 2;
        if (max_sz >= 0 && p - str + 1 >= max_sz)
            return max_sz;
    }
    return p - str;
}